

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pTVar1;
  GCObject *pGVar2;
  Value *pVVar3;
  int iVar4;
  TValue *io_1;
  TValue *io1;
  TValue *io2;
  Closure *cl;
  TValue *io;
  int n_local;
  lua_CFunction fn_local;
  lua_State *L_local;
  
  if (n == 0) {
    pTVar1 = L->top;
    (pTVar1->value_).f = fn;
    pTVar1->tt_ = 0x16;
  }
  else {
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    pGVar2 = (GCObject *)luaF_newCclosure(L,n);
    (pGVar2->h).node = (Node *)fn;
    L->top = L->top + -(long)n;
    io._4_4_ = n;
    while (iVar4 = io._4_4_ + -1, io._4_4_ != 0) {
      pTVar1 = L->top;
      pVVar3 = (Value *)((long)pGVar2 + (long)iVar4 * 0x10 + 0x20);
      *pVVar3 = pTVar1[iVar4].value_;
      pVVar3[1].b = pTVar1[iVar4].tt_;
      io._4_4_ = iVar4;
    }
    pTVar1 = L->top;
    (pTVar1->value_).gc = pGVar2;
    pTVar1->tt_ = 0x66;
  }
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
  }
  else {
    Closure *cl;
    api_checknelems(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    luaC_checkGC(L);
    cl = luaF_newCclosure(L, n);
    cl->c.f = fn;
    L->top -= n;
    while (n--)
      setobj2n(L, &cl->c.upvalue[n], L->top + n);
    setclCvalue(L, L->top, cl);
  }
  api_incr_top(L);
  lua_unlock(L);
}